

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

BaseType spirv_cross::to_unsigned_basetype(uint32_t width)

{
  uint uVar1;
  CompilerError *this;
  uint uVar2;
  allocator local_39;
  string local_38;
  
  uVar1 = width - 8 >> 3;
  uVar2 = width << 0x1d | uVar1;
  if ((uVar2 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(BaseType *)(&DAT_0030b97c + (ulong)uVar2 * 4);
  }
  this = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Invalid bit width.",&local_39);
  CompilerError::CompilerError(this,&local_38);
  __cxa_throw(this,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline SPIRType::BaseType to_unsigned_basetype(uint32_t width)
{
	switch (width)
	{
	case 8:
		return SPIRType::UByte;
	case 16:
		return SPIRType::UShort;
	case 32:
		return SPIRType::UInt;
	case 64:
		return SPIRType::UInt64;
	default:
		SPIRV_CROSS_THROW("Invalid bit width.");
	}
}